

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_mode_setting.cpp
# Opt level: O0

spv_result_t
spvtools::val::anon_unknown_1::ValidateExecutionMode(ValidationState_t *_,Instruction *inst)

{
  bool bVar1;
  Op OVar2;
  spv_result_t sVar3;
  int32_t iVar4;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvVar5;
  DiagnosticStream *pDVar6;
  vector<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_> *this;
  size_type sVar7;
  spv_const_context psVar8;
  string local_33e0;
  DiagnosticStream local_33c0;
  string local_31e8;
  DiagnosticStream local_31c8;
  DiagnosticStream local_2ff0;
  key_type local_2e14;
  DiagnosticStream local_2e10;
  key_type local_2c34;
  set<spv::ExecutionMode,_std::less<spv::ExecutionMode>,_std::allocator<spv::ExecutionMode>_>
  *local_2c30;
  set<spv::ExecutionMode,_std::less<spv::ExecutionMode>,_std::allocator<spv::ExecutionMode>_> *modes
  ;
  DiagnosticStream local_2a50;
  ValidationState_t *local_2878;
  _Base_ptr local_2870;
  _Rb_tree_const_iterator<spv::ExecutionModel> local_2868;
  DiagnosticStream local_2860;
  DiagnosticStream local_2688;
  _Base_ptr local_24a8;
  _Base_ptr local_24a0;
  DiagnosticStream local_2498;
  _Base_ptr local_22b8;
  _Base_ptr local_22b0;
  DiagnosticStream local_22a8;
  _Base_ptr local_20c8;
  _Base_ptr local_20c0;
  DiagnosticStream local_20b8;
  _Base_ptr local_1ed8;
  _Base_ptr local_1ed0;
  DiagnosticStream local_1ec8;
  DiagnosticStream local_1cf0;
  ValidationState_t *local_1b18;
  _Base_ptr local_1b10;
  _Rb_tree_const_iterator<spv::ExecutionModel> local_1b08;
  DiagnosticStream local_1b00;
  _Base_ptr local_1920;
  _Base_ptr local_1918;
  DiagnosticStream local_1910;
  _Base_ptr local_1730;
  _Base_ptr local_1728;
  DiagnosticStream local_1720;
  DiagnosticStream local_1548;
  ValidationState_t *local_1370;
  _Base_ptr local_1368;
  _Rb_tree_const_iterator<spv::ExecutionModel> local_1360;
  DiagnosticStream local_1358;
  _Base_ptr local_1178;
  _Base_ptr local_1170;
  set<spv::ExecutionModel,_std::less<spv::ExecutionModel>,_std::allocator<spv::ExecutionModel>_>
  *local_1168;
  set<spv::ExecutionModel,_std::less<spv::ExecutionModel>,_std::allocator<spv::ExecutionModel>_>
  *models;
  DiagnosticStream local_f88;
  DiagnosticStream local_db0;
  undefined4 local_bd4;
  undefined1 local_bd0 [4];
  FPFastMathModeMask reassoc_contract;
  DiagnosticStream local_9f8;
  undefined4 local_81c;
  undefined1 local_818 [4];
  uint32_t invalid_mask;
  tuple<bool,_bool,_unsigned_int> local_800;
  uint local_7f8;
  bool local_7f2;
  bool local_7f1;
  uint32_t value;
  bool is_const;
  bool is_int32;
  DiagnosticStream local_618;
  Instruction *local_440;
  Instruction *operand_inst;
  ulong uStack_430;
  uint operand_id;
  size_t i;
  size_t operand_count;
  char local_245;
  ExecutionMode local_244;
  undefined1 local_240 [3];
  bool valid_mode;
  ExecutionMode mode;
  DiagnosticStream local_220;
  __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_48;
  uint *local_40;
  __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_38;
  __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_30;
  __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  found;
  uint entry_point_id;
  Instruction *inst_local;
  ValidationState_t *__local;
  
  found._M_current._4_4_ = Instruction::GetOperandAs<unsigned_int>(inst,0);
  pvVar5 = ValidationState_t::entry_points(_);
  local_38._M_current =
       (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::cbegin(pvVar5);
  pvVar5 = ValidationState_t::entry_points(_);
  local_40 = (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::cend(pvVar5);
  local_30 = std::
             find<__gnu_cxx::__normal_iterator<unsigned_int_const*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,unsigned_int>
                       (local_38,(__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                                  )local_40,(uint *)((long)&found._M_current + 4));
  pvVar5 = ValidationState_t::entry_points(_);
  local_48._M_current =
       (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::cend(pvVar5);
  bVar1 = __gnu_cxx::operator==(&local_30,&local_48);
  if (bVar1) {
    ValidationState_t::diag(&local_220,_,SPV_ERROR_INVALID_ID,inst);
    pDVar6 = DiagnosticStream::operator<<
                       (&local_220,(char (*) [34])"OpExecutionMode Entry Point <id> ");
    ValidationState_t::getIdName_abi_cxx11_((string *)local_240,_,found._M_current._4_4_);
    pDVar6 = DiagnosticStream::operator<<
                       (pDVar6,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_240);
    pDVar6 = DiagnosticStream::operator<<
                       (pDVar6,(char (*) [52])" is not the Entry Point operand of an OpEntryPoint.")
    ;
    sVar3 = DiagnosticStream::operator_cast_to_spv_result_t(pDVar6);
    std::__cxx11::string::~string((string *)local_240);
    DiagnosticStream::~DiagnosticStream(&local_220);
    return sVar3;
  }
  local_244 = Instruction::GetOperandAs<spv::ExecutionMode>(inst,1);
  OVar2 = Instruction::opcode(inst);
  if (OVar2 == OpExecutionModeId) {
    if (((local_244 - ExecutionModeSubgroupsPerWorkgroupId < 3) ||
        (local_244 == ExecutionModeFPFastMathDefault)) ||
       (local_244 == ExecutionModeMaximumRegistersIdINTEL)) {
      local_245 = '\x01';
    }
    else {
      local_245 = '\0';
    }
    if (local_245 == '\0') {
      ValidationState_t::diag((DiagnosticStream *)&operand_count,_,SPV_ERROR_INVALID_ID,inst);
      pDVar6 = DiagnosticStream::operator<<
                         ((DiagnosticStream *)&operand_count,
                          (char (*) [123])
                          "OpExecutionModeId is only valid when the Mode operand is an execution mode that takes Extra Operands that are id operands."
                         );
      sVar3 = DiagnosticStream::operator_cast_to_spv_result_t(pDVar6);
      DiagnosticStream::~DiagnosticStream((DiagnosticStream *)&operand_count);
      return sVar3;
    }
    this = Instruction::operands(inst);
    i = std::vector<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>::size(this);
    for (uStack_430 = 2; uStack_430 < i; uStack_430 = uStack_430 + 1) {
      operand_inst._4_4_ = Instruction::GetOperandAs<unsigned_int>(inst,uStack_430);
      local_440 = ValidationState_t::FindDef(_,operand_inst._4_4_);
      if (local_244 - ExecutionModeSubgroupsPerWorkgroupId < 3) {
        OVar2 = Instruction::opcode(local_440);
        iVar4 = spvOpcodeIsConstant(OVar2);
        if (iVar4 == 0) {
          ValidationState_t::diag(&local_618,_,SPV_ERROR_INVALID_ID,inst);
          pDVar6 = DiagnosticStream::operator<<
                             (&local_618,
                              (char (*) [75])
                              "For OpExecutionModeId all Extra Operand ids must be constant instructions."
                             );
          sVar3 = DiagnosticStream::operator_cast_to_spv_result_t(pDVar6);
          DiagnosticStream::~DiagnosticStream(&local_618);
          return sVar3;
        }
      }
      else if (local_244 == ExecutionModeFPFastMathDefault) {
        if (uStack_430 == 2) {
          bVar1 = ValidationState_t::IsFloatScalarType(_,operand_inst._4_4_);
          if (!bVar1) {
            ValidationState_t::diag((DiagnosticStream *)&value,_,SPV_ERROR_INVALID_ID,inst);
            pDVar6 = DiagnosticStream::operator<<
                               ((DiagnosticStream *)&value,
                                (char (*) [61])
                                "The Target Type operand must be a floating-point scalar type");
            sVar3 = DiagnosticStream::operator_cast_to_spv_result_t(pDVar6);
            DiagnosticStream::~DiagnosticStream((DiagnosticStream *)&value);
            return sVar3;
          }
        }
        else {
          local_7f1 = false;
          local_7f2 = false;
          local_7f8 = 0;
          ValidationState_t::EvalInt32IfConst(&local_800,_,operand_inst._4_4_);
          std::tie<bool,bool,unsigned_int>
                    ((tuple<bool_&,_bool_&,_unsigned_int_&> *)local_818,&local_7f1,&local_7f2,
                     &local_7f8);
          std::tuple<bool&,bool&,unsigned_int&>::operator=
                    ((tuple<bool&,bool&,unsigned_int&> *)local_818,&local_800);
          if (((local_7f1 & 1U) == 0) || ((local_7f2 & 1U) == 0)) {
            ValidationState_t::diag(&local_f88,_,SPV_ERROR_INVALID_ID,inst);
            pDVar6 = DiagnosticStream::operator<<
                               (&local_f88,
                                (char (*) [68])
                                "The Fast Math Default operand must be a non-specialization constant"
                               );
            sVar3 = DiagnosticStream::operator_cast_to_spv_result_t(pDVar6);
            DiagnosticStream::~DiagnosticStream(&local_f88);
            return sVar3;
          }
          local_81c = 0xfff80000;
          if ((local_7f8 & 0xfff80000) != 0) {
            ValidationState_t::diag(&local_9f8,_,SPV_ERROR_INVALID_ID,inst);
            pDVar6 = DiagnosticStream::operator<<
                               (&local_9f8,
                                (char (*) [58])
                                "The Fast Math Default operand is an invalid bitmask value");
            sVar3 = DiagnosticStream::operator_cast_to_spv_result_t(pDVar6);
            DiagnosticStream::~DiagnosticStream(&local_9f8);
            return sVar3;
          }
          if ((local_7f8 & 0x10) != 0) {
            ValidationState_t::diag((DiagnosticStream *)local_bd0,_,SPV_ERROR_INVALID_ID,inst);
            pDVar6 = DiagnosticStream::operator<<
                               ((DiagnosticStream *)local_bd0,
                                (char (*) [52])"The Fast Math Default operand must not include Fast"
                               );
            sVar3 = DiagnosticStream::operator_cast_to_spv_result_t(pDVar6);
            DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_bd0);
            return sVar3;
          }
          local_bd4 = 0x30000;
          if (((local_7f8 & 0x40000) != 0) && ((local_7f8 & 0x30000) != 0x30000)) {
            ValidationState_t::diag(&local_db0,_,SPV_ERROR_INVALID_ID,inst);
            pDVar6 = DiagnosticStream::operator<<
                               (&local_db0,
                                (char (*) [107])
                                "The Fast Math Default operand must include AllowContract and AllowReassoc when AllowTransform is specified"
                               );
            sVar3 = DiagnosticStream::operator_cast_to_spv_result_t(pDVar6);
            DiagnosticStream::~DiagnosticStream(&local_db0);
            return sVar3;
          }
        }
      }
    }
  }
  else if ((((local_244 == ExecutionModeSubgroupsPerWorkgroupId) ||
            (local_244 == ExecutionModeLocalSizeHintId)) || (local_244 == ExecutionModeLocalSizeId))
          || (local_244 == ExecutionModeFPFastMathDefault)) {
    ValidationState_t::diag((DiagnosticStream *)&models,_,SPV_ERROR_INVALID_DATA,inst);
    pDVar6 = DiagnosticStream::operator<<
                       ((DiagnosticStream *)&models,
                        (char (*) [153])
                        "OpExecutionMode is only valid when the Mode operand is an execution mode that takes no Extra Operands, or takes Extra Operands that are not id operands."
                       );
    sVar3 = DiagnosticStream::operator_cast_to_spv_result_t(pDVar6);
    DiagnosticStream::~DiagnosticStream((DiagnosticStream *)&models);
    return sVar3;
  }
  local_1168 = ValidationState_t::GetExecutionModels(_,found._M_current._4_4_);
  if (local_244 == ExecutionModeInvocations) {
LAB_00328ae5:
    local_1170 = (_Base_ptr)
                 std::
                 set<spv::ExecutionModel,_std::less<spv::ExecutionModel>,_std::allocator<spv::ExecutionModel>_>
                 ::begin(local_1168);
    local_1178 = (_Base_ptr)
                 std::
                 set<spv::ExecutionModel,_std::less<spv::ExecutionModel>,_std::allocator<spv::ExecutionModel>_>
                 ::end(local_1168);
    bVar1 = std::
            all_of<std::_Rb_tree_const_iterator<spv::ExecutionModel>,spvtools::val::(anonymous_namespace)::ValidateExecutionMode(spvtools::val::ValidationState_t&,spvtools::val::Instruction_const*)::__0>
                      (local_1170,local_1178);
    if (!bVar1) {
      ValidationState_t::diag(&local_1358,_,SPV_ERROR_INVALID_DATA,inst);
      pDVar6 = DiagnosticStream::operator<<
                         (&local_1358,
                          (char (*) [67])
                          "Execution mode can only be used with the Geometry execution model.");
      sVar3 = DiagnosticStream::operator_cast_to_spv_result_t(pDVar6);
      DiagnosticStream::~DiagnosticStream(&local_1358);
      return sVar3;
    }
    goto LAB_00329232;
  }
  if (local_244 - ExecutionModeSpacingEqual < 5) {
LAB_00328c7d:
    local_1728 = (_Base_ptr)
                 std::
                 set<spv::ExecutionModel,_std::less<spv::ExecutionModel>,_std::allocator<spv::ExecutionModel>_>
                 ::begin(local_1168);
    local_1730 = (_Base_ptr)
                 std::
                 set<spv::ExecutionModel,_std::less<spv::ExecutionModel>,_std::allocator<spv::ExecutionModel>_>
                 ::end(local_1168);
    bVar1 = std::
            all_of<std::_Rb_tree_const_iterator<spv::ExecutionModel>,spvtools::val::(anonymous_namespace)::ValidateExecutionMode(spvtools::val::ValidationState_t&,spvtools::val::Instruction_const*)::__2>
                      (local_1728,local_1730);
    if (!bVar1) {
      ValidationState_t::diag(&local_1910,_,SPV_ERROR_INVALID_DATA,inst);
      pDVar6 = DiagnosticStream::operator<<
                         (&local_1910,
                          (char (*) [69])
                          "Execution mode can only be used with a tessellation execution model.");
      sVar3 = DiagnosticStream::operator_cast_to_spv_result_t(pDVar6);
      DiagnosticStream::~DiagnosticStream(&local_1910);
      return sVar3;
    }
  }
  else {
    if (3 < local_244 - ExecutionModePixelCenterInteger) {
      if (local_244 == ExecutionModePointMode) goto LAB_00328c7d;
      if ((local_244 != DepthReplacing) && (2 < local_244 - DepthGreater)) {
        if (local_244 == ExecutionModeLocalSize) {
LAB_003290c7:
          if ((local_244 == ExecutionModeLocalSizeId) &&
             (bVar1 = ValidationState_t::IsLocalSizeIdAllowed(_), !bVar1)) {
            ValidationState_t::diag(&local_2860,_,SPV_ERROR_INVALID_DATA,inst);
            pDVar6 = DiagnosticStream::operator<<
                               (&local_2860,
                                (char (*) [60])
                                "LocalSizeId mode is not allowed by the current environment.");
            sVar3 = DiagnosticStream::operator_cast_to_spv_result_t(pDVar6);
            DiagnosticStream::~DiagnosticStream(&local_2860);
            return sVar3;
          }
          local_2868._M_node =
               (_Base_ptr)
               std::
               set<spv::ExecutionModel,_std::less<spv::ExecutionModel>,_std::allocator<spv::ExecutionModel>_>
               ::begin(local_1168);
          local_2870 = (_Base_ptr)
                       std::
                       set<spv::ExecutionModel,_std::less<spv::ExecutionModel>,_std::allocator<spv::ExecutionModel>_>
                       ::end(local_1168);
          local_2878 = _;
          bVar1 = std::
                  all_of<std::_Rb_tree_const_iterator<spv::ExecutionModel>,spvtools::val::(anonymous_namespace)::ValidateExecutionMode(spvtools::val::ValidationState_t&,spvtools::val::Instruction_const*)::__9>
                            (local_2868,(_Rb_tree_const_iterator<spv::ExecutionModel>)local_2870,
                             (anon_class_8_1_54a397ff)_);
          if (!bVar1) {
            bVar1 = ValidationState_t::HasCapability(_,CapabilityMeshShadingNV);
            if ((!bVar1) &&
               (bVar1 = ValidationState_t::HasCapability(_,CapabilityMeshShadingEXT), !bVar1)) {
              ValidationState_t::diag((DiagnosticStream *)&modes,_,SPV_ERROR_INVALID_DATA,inst);
              pDVar6 = DiagnosticStream::operator<<
                                 ((DiagnosticStream *)&modes,
                                  (char (*) [76])
                                  "Execution mode can only be used with a Kernel or GLCompute execution model."
                                 );
              sVar3 = DiagnosticStream::operator_cast_to_spv_result_t(pDVar6);
              DiagnosticStream::~DiagnosticStream((DiagnosticStream *)&modes);
              return sVar3;
            }
            ValidationState_t::diag(&local_2a50,_,SPV_ERROR_INVALID_DATA,inst);
            pDVar6 = DiagnosticStream::operator<<
                               (&local_2a50,
                                (char (*) [110])
                                "Execution mode can only be used with a Kernel, GLCompute, MeshNV, MeshEXT, TaskNV or TaskEXT execution model."
                               );
            sVar3 = DiagnosticStream::operator_cast_to_spv_result_t(pDVar6);
            DiagnosticStream::~DiagnosticStream(&local_2a50);
            return sVar3;
          }
          goto LAB_00329232;
        }
        if (local_244 == ExecutionModeLocalSizeHint) {
LAB_0032903d:
          local_24a0 = (_Base_ptr)
                       std::
                       set<spv::ExecutionModel,_std::less<spv::ExecutionModel>,_std::allocator<spv::ExecutionModel>_>
                       ::begin(local_1168);
          local_24a8 = (_Base_ptr)
                       std::
                       set<spv::ExecutionModel,_std::less<spv::ExecutionModel>,_std::allocator<spv::ExecutionModel>_>
                       ::end(local_1168);
          bVar1 = std::
                  all_of<std::_Rb_tree_const_iterator<spv::ExecutionModel>,spvtools::val::(anonymous_namespace)::ValidateExecutionMode(spvtools::val::ValidationState_t&,spvtools::val::Instruction_const*)::__8>
                            (local_24a0,local_24a8);
          if (!bVar1) {
            ValidationState_t::diag(&local_2688,_,SPV_ERROR_INVALID_DATA,inst);
            pDVar6 = DiagnosticStream::operator<<
                               (&local_2688,
                                (char (*) [65])
                                "Execution mode can only be used with the Kernel execution model.");
            sVar3 = DiagnosticStream::operator_cast_to_spv_result_t(pDVar6);
            DiagnosticStream::~DiagnosticStream(&local_2688);
            return sVar3;
          }
          goto LAB_00329232;
        }
        if (2 < local_244 - ExecutionModeInputPoints) {
          if (local_244 == ExecutionModeTriangles) {
            local_1918 = (_Base_ptr)
                         std::
                         set<spv::ExecutionModel,_std::less<spv::ExecutionModel>,_std::allocator<spv::ExecutionModel>_>
                         ::begin(local_1168);
            local_1920 = (_Base_ptr)
                         std::
                         set<spv::ExecutionModel,_std::less<spv::ExecutionModel>,_std::allocator<spv::ExecutionModel>_>
                         ::end(local_1168);
            bVar1 = std::
                    all_of<std::_Rb_tree_const_iterator<spv::ExecutionModel>,spvtools::val::(anonymous_namespace)::ValidateExecutionMode(spvtools::val::ValidationState_t&,spvtools::val::Instruction_const*)::__3>
                              (local_1918,local_1920);
            if (!bVar1) {
              ValidationState_t::diag(&local_1b00,_,SPV_ERROR_INVALID_DATA,inst);
              pDVar6 = DiagnosticStream::operator<<
                                 (&local_1b00,
                                  (char (*) [81])
                                  "Execution mode can only be used with a Geometry or tessellation execution model."
                                 );
              sVar3 = DiagnosticStream::operator_cast_to_spv_result_t(pDVar6);
              DiagnosticStream::~DiagnosticStream(&local_1b00);
              return sVar3;
            }
            goto LAB_00329232;
          }
          if (local_244 != ExecutionModeInputTrianglesAdjacency) {
            if (local_244 - ExecutionModeQuads < 2) goto LAB_00328c7d;
            if (local_244 == ExecutionModeOutputVertices) {
              local_1b08._M_node =
                   (_Base_ptr)
                   std::
                   set<spv::ExecutionModel,_std::less<spv::ExecutionModel>,_std::allocator<spv::ExecutionModel>_>
                   ::begin(local_1168);
              local_1b10 = (_Base_ptr)
                           std::
                           set<spv::ExecutionModel,_std::less<spv::ExecutionModel>,_std::allocator<spv::ExecutionModel>_>
                           ::end(local_1168);
              local_1b18 = _;
              bVar1 = std::
                      all_of<std::_Rb_tree_const_iterator<spv::ExecutionModel>,spvtools::val::(anonymous_namespace)::ValidateExecutionMode(spvtools::val::ValidationState_t&,spvtools::val::Instruction_const*)::__4>
                                (local_1b08,(_Rb_tree_const_iterator<spv::ExecutionModel>)local_1b10
                                 ,(anon_class_8_1_54a397ff)_);
              if (!bVar1) {
                bVar1 = ValidationState_t::HasCapability(_,CapabilityMeshShadingNV);
                if ((!bVar1) &&
                   (bVar1 = ValidationState_t::HasCapability(_,CapabilityMeshShadingEXT), !bVar1)) {
                  ValidationState_t::diag(&local_1ec8,_,SPV_ERROR_INVALID_DATA,inst);
                  pDVar6 = DiagnosticStream::operator<<
                                     (&local_1ec8,
                                      (char (*) [81])
                                      "Execution mode can only be used with a Geometry or tessellation execution model."
                                     );
                  sVar3 = DiagnosticStream::operator_cast_to_spv_result_t(pDVar6);
                  DiagnosticStream::~DiagnosticStream(&local_1ec8);
                  return sVar3;
                }
                ValidationState_t::diag(&local_1cf0,_,SPV_ERROR_INVALID_DATA,inst);
                pDVar6 = DiagnosticStream::operator<<
                                   (&local_1cf0,
                                    (char (*) [98])
                                    "Execution mode can only be used with a Geometry, tessellation, MeshNV or MeshEXT execution model."
                                   );
                sVar3 = DiagnosticStream::operator_cast_to_spv_result_t(pDVar6);
                DiagnosticStream::~DiagnosticStream(&local_1cf0);
                return sVar3;
              }
              goto LAB_00329232;
            }
            if (local_244 == ExecutionModeOutputPoints) {
              local_1360._M_node =
                   (_Base_ptr)
                   std::
                   set<spv::ExecutionModel,_std::less<spv::ExecutionModel>,_std::allocator<spv::ExecutionModel>_>
                   ::begin(local_1168);
              local_1368 = (_Base_ptr)
                           std::
                           set<spv::ExecutionModel,_std::less<spv::ExecutionModel>,_std::allocator<spv::ExecutionModel>_>
                           ::end(local_1168);
              local_1370 = _;
              bVar1 = std::
                      all_of<std::_Rb_tree_const_iterator<spv::ExecutionModel>,spvtools::val::(anonymous_namespace)::ValidateExecutionMode(spvtools::val::ValidationState_t&,spvtools::val::Instruction_const*)::__1>
                                (local_1360,(_Rb_tree_const_iterator<spv::ExecutionModel>)local_1368
                                 ,(anon_class_8_1_54a397ff)_);
              if (!bVar1) {
                bVar1 = ValidationState_t::HasCapability(_,CapabilityMeshShadingNV);
                if ((!bVar1) &&
                   (bVar1 = ValidationState_t::HasCapability(_,CapabilityMeshShadingEXT), !bVar1)) {
                  ValidationState_t::diag(&local_1720,_,SPV_ERROR_INVALID_DATA,inst);
                  pDVar6 = DiagnosticStream::operator<<
                                     (&local_1720,
                                      (char (*) [67])
                                      "Execution mode can only be used with the Geometry execution model."
                                     );
                  sVar3 = DiagnosticStream::operator_cast_to_spv_result_t(pDVar6);
                  DiagnosticStream::~DiagnosticStream(&local_1720);
                  return sVar3;
                }
                ValidationState_t::diag(&local_1548,_,SPV_ERROR_INVALID_DATA,inst);
                pDVar6 = DiagnosticStream::operator<<
                                   (&local_1548,
                                    (char (*) [85])
                                    "Execution mode can only be used with the Geometry MeshNV or MeshEXT execution model."
                                   );
                sVar3 = DiagnosticStream::operator_cast_to_spv_result_t(pDVar6);
                DiagnosticStream::~DiagnosticStream(&local_1548);
                return sVar3;
              }
              goto LAB_00329232;
            }
            if (1 < local_244 - ExecutionModeOutputLineStrip) {
              if (1 < local_244 - ExecutionModeVecTypeHint) {
                if (local_244 == ExecutionModeLocalSizeId) goto LAB_003290c7;
                if (local_244 != ExecutionModeLocalSizeHintId) {
                  if (((2 < local_244 - ExecutionModeNonCoherentColorAttachmentReadEXT) &&
                      (local_244 != EarlyAndLateFragmentTestsAMD)) &&
                     (5 < local_244 - ExecutionModeStencilRefUnchangedFrontAMD)) {
                    if (local_244 == ExecutionModeQuadDerivativesKHR) {
                      local_20c0 = (_Base_ptr)
                                   std::
                                   set<spv::ExecutionModel,_std::less<spv::ExecutionModel>,_std::allocator<spv::ExecutionModel>_>
                                   ::begin(local_1168);
                      local_20c8 = (_Base_ptr)
                                   std::
                                   set<spv::ExecutionModel,_std::less<spv::ExecutionModel>,_std::allocator<spv::ExecutionModel>_>
                                   ::end(local_1168);
                      bVar1 = std::
                              all_of<std::_Rb_tree_const_iterator<spv::ExecutionModel>,spvtools::val::(anonymous_namespace)::ValidateExecutionMode(spvtools::val::ValidationState_t&,spvtools::val::Instruction_const*)::__6>
                                        (local_20c0,local_20c8);
                      if (!bVar1) {
                        ValidationState_t::diag(&local_22a8,_,SPV_ERROR_INVALID_DATA,inst);
                        pDVar6 = DiagnosticStream::operator<<
                                           (&local_22a8,
                                            (char (*) [80])
                                            "Execution mode can only be used with the Fragment or GLCompute execution model."
                                           );
                        sVar3 = DiagnosticStream::operator_cast_to_spv_result_t(pDVar6);
                        DiagnosticStream::~DiagnosticStream(&local_22a8);
                        return sVar3;
                      }
                      goto LAB_00329232;
                    }
                    if (local_244 != ExecutionModeRequireFullQuadsKHR) {
                      if ((local_244 - ExecutionModeOutputLinesEXT < 2) ||
                         (local_244 == ExecutionModeOutputTrianglesEXT)) {
                        local_1ed0 = (_Base_ptr)
                                     std::
                                     set<spv::ExecutionModel,_std::less<spv::ExecutionModel>,_std::allocator<spv::ExecutionModel>_>
                                     ::begin(local_1168);
                        local_1ed8 = (_Base_ptr)
                                     std::
                                     set<spv::ExecutionModel,_std::less<spv::ExecutionModel>,_std::allocator<spv::ExecutionModel>_>
                                     ::end(local_1168);
                        bVar1 = std::
                                all_of<std::_Rb_tree_const_iterator<spv::ExecutionModel>,spvtools::val::(anonymous_namespace)::ValidateExecutionMode(spvtools::val::ValidationState_t&,spvtools::val::Instruction_const*)::__5>
                                          (local_1ed0,local_1ed8);
                        if (!bVar1) {
                          ValidationState_t::diag(&local_20b8,_,SPV_ERROR_INVALID_DATA,inst);
                          pDVar6 = DiagnosticStream::operator<<
                                             (&local_20b8,
                                              (char (*) [76])
                                              "Execution mode can only be used with the MeshEXT or MeshNV execution model."
                                             );
                          sVar3 = DiagnosticStream::operator_cast_to_spv_result_t(pDVar6);
                          DiagnosticStream::~DiagnosticStream(&local_20b8);
                          return sVar3;
                        }
                        goto LAB_00329232;
                      }
                      if (5 < local_244 - ExecutionModePixelInterlockOrderedEXT) goto LAB_00329232;
                    }
                  }
                  goto LAB_00328fb3;
                }
              }
              goto LAB_0032903d;
            }
          }
        }
        goto LAB_00328ae5;
      }
    }
LAB_00328fb3:
    local_22b0 = (_Base_ptr)
                 std::
                 set<spv::ExecutionModel,_std::less<spv::ExecutionModel>,_std::allocator<spv::ExecutionModel>_>
                 ::begin(local_1168);
    local_22b8 = (_Base_ptr)
                 std::
                 set<spv::ExecutionModel,_std::less<spv::ExecutionModel>,_std::allocator<spv::ExecutionModel>_>
                 ::end(local_1168);
    bVar1 = std::
            all_of<std::_Rb_tree_const_iterator<spv::ExecutionModel>,spvtools::val::(anonymous_namespace)::ValidateExecutionMode(spvtools::val::ValidationState_t&,spvtools::val::Instruction_const*)::__7>
                      (local_22b0,local_22b8);
    if (!bVar1) {
      ValidationState_t::diag(&local_2498,_,SPV_ERROR_INVALID_DATA,inst);
      pDVar6 = DiagnosticStream::operator<<
                         (&local_2498,
                          (char (*) [67])
                          "Execution mode can only be used with the Fragment execution model.");
      sVar3 = DiagnosticStream::operator_cast_to_spv_result_t(pDVar6);
      DiagnosticStream::~DiagnosticStream(&local_2498);
      return sVar3;
    }
  }
LAB_00329232:
  if (local_244 == ExecutionModeFPFastMathDefault) {
    local_2c30 = ValidationState_t::GetExecutionModes(_,found._M_current._4_4_);
    bVar1 = false;
    if (local_2c30 !=
        (set<spv::ExecutionMode,_std::less<spv::ExecutionMode>,_std::allocator<spv::ExecutionMode>_>
         *)0x0) {
      local_2c34 = ContractionOff;
      sVar7 = std::
              set<spv::ExecutionMode,_std::less<spv::ExecutionMode>,_std::allocator<spv::ExecutionMode>_>
              ::count(local_2c30,&local_2c34);
      bVar1 = sVar7 != 0;
    }
    if (bVar1) {
      ValidationState_t::diag(&local_2e10,_,SPV_ERROR_INVALID_DATA,inst);
      pDVar6 = DiagnosticStream::operator<<
                         (&local_2e10,
                          (char (*) [95])
                          "FPFastMathDefault and ContractionOff execution modes cannot be applied to the same entry point"
                         );
      sVar3 = DiagnosticStream::operator_cast_to_spv_result_t(pDVar6);
      DiagnosticStream::~DiagnosticStream(&local_2e10);
      return sVar3;
    }
    bVar1 = false;
    if (local_2c30 !=
        (set<spv::ExecutionMode,_std::less<spv::ExecutionMode>,_std::allocator<spv::ExecutionMode>_>
         *)0x0) {
      local_2e14 = ExecutionModeSignedZeroInfNanPreserve;
      sVar7 = std::
              set<spv::ExecutionMode,_std::less<spv::ExecutionMode>,_std::allocator<spv::ExecutionMode>_>
              ::count(local_2c30,&local_2e14);
      bVar1 = sVar7 != 0;
    }
    if (bVar1) {
      ValidationState_t::diag(&local_2ff0,_,SPV_ERROR_INVALID_DATA,inst);
      pDVar6 = DiagnosticStream::operator<<
                         (&local_2ff0,
                          (char (*) [105])
                          "FPFastMathDefault and SignedZeroInfNanPreserve execution modes cannot be applied to the same entry point"
                         );
      sVar3 = DiagnosticStream::operator_cast_to_spv_result_t(pDVar6);
      DiagnosticStream::~DiagnosticStream(&local_2ff0);
      return sVar3;
    }
  }
  psVar8 = ValidationState_t::context(_);
  bVar1 = spvIsVulkanEnv(psVar8->target_env);
  if (bVar1) {
    if (local_244 == ExecutionModeOriginLowerLeft) {
      ValidationState_t::diag(&local_31c8,_,SPV_ERROR_INVALID_DATA,inst);
      ValidationState_t::VkErrorID_abi_cxx11_(&local_31e8,_,0x122d,(char *)0x0);
      pDVar6 = DiagnosticStream::operator<<(&local_31c8,&local_31e8);
      pDVar6 = DiagnosticStream::operator<<
                         (pDVar6,(char (*) [80])
                                 "In the Vulkan environment, the OriginLowerLeft execution mode must not be used."
                         );
      sVar3 = DiagnosticStream::operator_cast_to_spv_result_t(pDVar6);
      std::__cxx11::string::~string((string *)&local_31e8);
      DiagnosticStream::~DiagnosticStream(&local_31c8);
      return sVar3;
    }
    if (local_244 == ExecutionModePixelCenterInteger) {
      ValidationState_t::diag(&local_33c0,_,SPV_ERROR_INVALID_DATA,inst);
      ValidationState_t::VkErrorID_abi_cxx11_(&local_33e0,_,0x122e,(char *)0x0);
      pDVar6 = DiagnosticStream::operator<<(&local_33c0,&local_33e0);
      pDVar6 = DiagnosticStream::operator<<
                         (pDVar6,(char (*) [83])
                                 "In the Vulkan environment, the PixelCenterInteger execution mode must not be used."
                         );
      sVar3 = DiagnosticStream::operator_cast_to_spv_result_t(pDVar6);
      std::__cxx11::string::~string((string *)&local_33e0);
      DiagnosticStream::~DiagnosticStream(&local_33c0);
      return sVar3;
    }
  }
  return SPV_SUCCESS;
}

Assistant:

spv_result_t ValidateExecutionMode(ValidationState_t& _,
                                   const Instruction* inst) {
  const auto entry_point_id = inst->GetOperandAs<uint32_t>(0);
  const auto found = std::find(_.entry_points().cbegin(),
                               _.entry_points().cend(), entry_point_id);
  if (found == _.entry_points().cend()) {
    return _.diag(SPV_ERROR_INVALID_ID, inst)
           << "OpExecutionMode Entry Point <id> " << _.getIdName(entry_point_id)
           << " is not the Entry Point "
              "operand of an OpEntryPoint.";
  }

  const auto mode = inst->GetOperandAs<spv::ExecutionMode>(1);
  if (inst->opcode() == spv::Op::OpExecutionModeId) {
    bool valid_mode = false;
    switch (mode) {
      case spv::ExecutionMode::SubgroupsPerWorkgroupId:
      case spv::ExecutionMode::LocalSizeHintId:
      case spv::ExecutionMode::LocalSizeId:
      case spv::ExecutionMode::FPFastMathDefault:
      case spv::ExecutionMode::MaximumRegistersIdINTEL:
        valid_mode = true;
        break;
      default:
        valid_mode = false;
        break;
    }
    if (!valid_mode) {
      return _.diag(SPV_ERROR_INVALID_ID, inst)
             << "OpExecutionModeId is only valid when the Mode operand is an "
                "execution mode that takes Extra Operands that are id "
                "operands.";
    }

    size_t operand_count = inst->operands().size();
    for (size_t i = 2; i < operand_count; ++i) {
      const auto operand_id = inst->GetOperandAs<uint32_t>(i);
      const auto* operand_inst = _.FindDef(operand_id);
      switch (mode) {
        case spv::ExecutionMode::SubgroupsPerWorkgroupId:
        case spv::ExecutionMode::LocalSizeHintId:
        case spv::ExecutionMode::LocalSizeId:
          if (!spvOpcodeIsConstant(operand_inst->opcode())) {
            return _.diag(SPV_ERROR_INVALID_ID, inst)
                   << "For OpExecutionModeId all Extra Operand ids must be "
                      "constant instructions.";
          }
          break;
        case spv::ExecutionMode::FPFastMathDefault:
          if (i == 2) {
            if (!_.IsFloatScalarType(operand_id)) {
              return _.diag(SPV_ERROR_INVALID_ID, inst)
                     << "The Target Type operand must be a floating-point "
                        "scalar type";
            }
          } else {
            bool is_int32 = false;
            bool is_const = false;
            uint32_t value = 0;
            std::tie(is_int32, is_const, value) =
                _.EvalInt32IfConst(operand_id);
            if (is_int32 && is_const) {
              // Valid values include up to 0x00040000 (AllowTransform).
              uint32_t invalid_mask = 0xfff80000;
              if ((invalid_mask & value) != 0) {
                return _.diag(SPV_ERROR_INVALID_ID, inst)
                       << "The Fast Math Default operand is an invalid bitmask "
                          "value";
              }
              if (value &
                  static_cast<uint32_t>(spv::FPFastMathModeMask::Fast)) {
                return _.diag(SPV_ERROR_INVALID_ID, inst)
                       << "The Fast Math Default operand must not include Fast";
              }
              const auto reassoc_contract =
                  spv::FPFastMathModeMask::AllowContract |
                  spv::FPFastMathModeMask::AllowReassoc;
              if ((value & static_cast<uint32_t>(
                               spv::FPFastMathModeMask::AllowTransform)) != 0 &&
                  ((value & static_cast<uint32_t>(reassoc_contract)) !=
                   static_cast<uint32_t>(reassoc_contract))) {
                return _.diag(SPV_ERROR_INVALID_ID, inst)
                       << "The Fast Math Default operand must include "
                          "AllowContract and AllowReassoc when AllowTransform "
                          "is specified";
              }
            } else {
              return _.diag(SPV_ERROR_INVALID_ID, inst)
                     << "The Fast Math Default operand must be a "
                        "non-specialization constant";
            }
          }
          break;
        default:
          break;
      }
    }
  } else if (mode == spv::ExecutionMode::SubgroupsPerWorkgroupId ||
             mode == spv::ExecutionMode::LocalSizeHintId ||
             mode == spv::ExecutionMode::LocalSizeId ||
             mode == spv::ExecutionMode::FPFastMathDefault) {
    return _.diag(SPV_ERROR_INVALID_DATA, inst)
           << "OpExecutionMode is only valid when the Mode operand is an "
              "execution mode that takes no Extra Operands, or takes Extra "
              "Operands that are not id operands.";
  }

  const auto* models = _.GetExecutionModels(entry_point_id);
  switch (mode) {
    case spv::ExecutionMode::Invocations:
    case spv::ExecutionMode::InputPoints:
    case spv::ExecutionMode::InputLines:
    case spv::ExecutionMode::InputLinesAdjacency:
    case spv::ExecutionMode::InputTrianglesAdjacency:
    case spv::ExecutionMode::OutputLineStrip:
    case spv::ExecutionMode::OutputTriangleStrip:
      if (!std::all_of(models->begin(), models->end(),
                       [](const spv::ExecutionModel& model) {
                         return model == spv::ExecutionModel::Geometry;
                       })) {
        return _.diag(SPV_ERROR_INVALID_DATA, inst)
               << "Execution mode can only be used with the Geometry execution "
                  "model.";
      }
      break;
    case spv::ExecutionMode::OutputPoints:
      if (!std::all_of(
              models->begin(), models->end(),
              [&_](const spv::ExecutionModel& model) {
                switch (model) {
                  case spv::ExecutionModel::Geometry:
                    return true;
                  case spv::ExecutionModel::MeshNV:
                    return _.HasCapability(spv::Capability::MeshShadingNV);
                  case spv::ExecutionModel::MeshEXT:
                    return _.HasCapability(spv::Capability::MeshShadingEXT);
                  default:
                    return false;
                }
              })) {
        if (_.HasCapability(spv::Capability::MeshShadingNV) ||
            _.HasCapability(spv::Capability::MeshShadingEXT)) {
          return _.diag(SPV_ERROR_INVALID_DATA, inst)
                 << "Execution mode can only be used with the Geometry "
                    "MeshNV or MeshEXT execution model.";
        } else {
          return _.diag(SPV_ERROR_INVALID_DATA, inst)
                 << "Execution mode can only be used with the Geometry "
                    "execution "
                    "model.";
        }
      }
      break;
    case spv::ExecutionMode::SpacingEqual:
    case spv::ExecutionMode::SpacingFractionalEven:
    case spv::ExecutionMode::SpacingFractionalOdd:
    case spv::ExecutionMode::VertexOrderCw:
    case spv::ExecutionMode::VertexOrderCcw:
    case spv::ExecutionMode::PointMode:
    case spv::ExecutionMode::Quads:
    case spv::ExecutionMode::Isolines:
      if (!std::all_of(
              models->begin(), models->end(),
              [](const spv::ExecutionModel& model) {
                return (model == spv::ExecutionModel::TessellationControl) ||
                       (model == spv::ExecutionModel::TessellationEvaluation);
              })) {
        return _.diag(SPV_ERROR_INVALID_DATA, inst)
               << "Execution mode can only be used with a tessellation "
                  "execution model.";
      }
      break;
    case spv::ExecutionMode::Triangles:
      if (!std::all_of(models->begin(), models->end(),
                       [](const spv::ExecutionModel& model) {
                         switch (model) {
                           case spv::ExecutionModel::Geometry:
                           case spv::ExecutionModel::TessellationControl:
                           case spv::ExecutionModel::TessellationEvaluation:
                             return true;
                           default:
                             return false;
                         }
                       })) {
        return _.diag(SPV_ERROR_INVALID_DATA, inst)
               << "Execution mode can only be used with a Geometry or "
                  "tessellation execution model.";
      }
      break;
    case spv::ExecutionMode::OutputVertices:
      if (!std::all_of(
              models->begin(), models->end(),
              [&_](const spv::ExecutionModel& model) {
                switch (model) {
                  case spv::ExecutionModel::Geometry:
                  case spv::ExecutionModel::TessellationControl:
                  case spv::ExecutionModel::TessellationEvaluation:
                    return true;
                  case spv::ExecutionModel::MeshNV:
                    return _.HasCapability(spv::Capability::MeshShadingNV);
                  case spv::ExecutionModel::MeshEXT:
                    return _.HasCapability(spv::Capability::MeshShadingEXT);
                  default:
                    return false;
                }
              })) {
        if (_.HasCapability(spv::Capability::MeshShadingNV) ||
            _.HasCapability(spv::Capability::MeshShadingEXT)) {
          return _.diag(SPV_ERROR_INVALID_DATA, inst)
                 << "Execution mode can only be used with a Geometry, "
                    "tessellation, MeshNV or MeshEXT execution model.";
        } else {
          return _.diag(SPV_ERROR_INVALID_DATA, inst)
                 << "Execution mode can only be used with a Geometry or "
                    "tessellation execution model.";
        }
      }
      break;
    case spv::ExecutionMode::OutputLinesEXT:
    case spv::ExecutionMode::OutputTrianglesEXT:
    case spv::ExecutionMode::OutputPrimitivesEXT:
      if (!std::all_of(models->begin(), models->end(),
                       [](const spv::ExecutionModel& model) {
                         return (model == spv::ExecutionModel::MeshEXT ||
                                 model == spv::ExecutionModel::MeshNV);
                       })) {
        return _.diag(SPV_ERROR_INVALID_DATA, inst)
               << "Execution mode can only be used with the MeshEXT or MeshNV "
                  "execution "
                  "model.";
      }
      break;
    case spv::ExecutionMode::QuadDerivativesKHR:
      if (!std::all_of(models->begin(), models->end(),
                       [](const spv::ExecutionModel& model) {
                         return (model == spv::ExecutionModel::Fragment ||
                                 model == spv::ExecutionModel::GLCompute);
                       })) {
        return _.diag(SPV_ERROR_INVALID_DATA, inst)
               << "Execution mode can only be used with the Fragment or "
                  "GLCompute execution model.";
      }
      break;
    case spv::ExecutionMode::PixelCenterInteger:
    case spv::ExecutionMode::OriginUpperLeft:
    case spv::ExecutionMode::OriginLowerLeft:
    case spv::ExecutionMode::EarlyFragmentTests:
    case spv::ExecutionMode::DepthReplacing:
    case spv::ExecutionMode::DepthGreater:
    case spv::ExecutionMode::DepthLess:
    case spv::ExecutionMode::DepthUnchanged:
    case spv::ExecutionMode::NonCoherentColorAttachmentReadEXT:
    case spv::ExecutionMode::NonCoherentDepthAttachmentReadEXT:
    case spv::ExecutionMode::NonCoherentStencilAttachmentReadEXT:
    case spv::ExecutionMode::PixelInterlockOrderedEXT:
    case spv::ExecutionMode::PixelInterlockUnorderedEXT:
    case spv::ExecutionMode::SampleInterlockOrderedEXT:
    case spv::ExecutionMode::SampleInterlockUnorderedEXT:
    case spv::ExecutionMode::ShadingRateInterlockOrderedEXT:
    case spv::ExecutionMode::ShadingRateInterlockUnorderedEXT:
    case spv::ExecutionMode::EarlyAndLateFragmentTestsAMD:
    case spv::ExecutionMode::StencilRefUnchangedFrontAMD:
    case spv::ExecutionMode::StencilRefGreaterFrontAMD:
    case spv::ExecutionMode::StencilRefLessFrontAMD:
    case spv::ExecutionMode::StencilRefUnchangedBackAMD:
    case spv::ExecutionMode::StencilRefGreaterBackAMD:
    case spv::ExecutionMode::StencilRefLessBackAMD:
    case spv::ExecutionMode::RequireFullQuadsKHR:
      if (!std::all_of(models->begin(), models->end(),
                       [](const spv::ExecutionModel& model) {
                         return model == spv::ExecutionModel::Fragment;
                       })) {
        return _.diag(SPV_ERROR_INVALID_DATA, inst)
               << "Execution mode can only be used with the Fragment execution "
                  "model.";
      }
      break;
    case spv::ExecutionMode::LocalSizeHint:
    case spv::ExecutionMode::VecTypeHint:
    case spv::ExecutionMode::ContractionOff:
    case spv::ExecutionMode::LocalSizeHintId:
      if (!std::all_of(models->begin(), models->end(),
                       [](const spv::ExecutionModel& model) {
                         return model == spv::ExecutionModel::Kernel;
                       })) {
        return _.diag(SPV_ERROR_INVALID_DATA, inst)
               << "Execution mode can only be used with the Kernel execution "
                  "model.";
      }
      break;
    case spv::ExecutionMode::LocalSize:
    case spv::ExecutionMode::LocalSizeId:
      if (mode == spv::ExecutionMode::LocalSizeId && !_.IsLocalSizeIdAllowed())
        return _.diag(SPV_ERROR_INVALID_DATA, inst)
               << "LocalSizeId mode is not allowed by the current environment.";

      if (!std::all_of(
              models->begin(), models->end(),
              [&_](const spv::ExecutionModel& model) {
                switch (model) {
                  case spv::ExecutionModel::Kernel:
                  case spv::ExecutionModel::GLCompute:
                    return true;
                  case spv::ExecutionModel::TaskNV:
                  case spv::ExecutionModel::MeshNV:
                    return _.HasCapability(spv::Capability::MeshShadingNV);
                  case spv::ExecutionModel::TaskEXT:
                  case spv::ExecutionModel::MeshEXT:
                    return _.HasCapability(spv::Capability::MeshShadingEXT);
                  default:
                    return false;
                }
              })) {
        if (_.HasCapability(spv::Capability::MeshShadingNV) ||
            _.HasCapability(spv::Capability::MeshShadingEXT)) {
          return _.diag(SPV_ERROR_INVALID_DATA, inst)
                 << "Execution mode can only be used with a Kernel, GLCompute, "
                    "MeshNV, MeshEXT, TaskNV or TaskEXT execution model.";
        } else {
          return _.diag(SPV_ERROR_INVALID_DATA, inst)
                 << "Execution mode can only be used with a Kernel or "
                    "GLCompute "
                    "execution model.";
        }
      }
    default:
      break;
  }

  if (mode == spv::ExecutionMode::FPFastMathDefault) {
    const auto* modes = _.GetExecutionModes(entry_point_id);
    if (modes && modes->count(spv::ExecutionMode::ContractionOff)) {
      return _.diag(SPV_ERROR_INVALID_DATA, inst)
             << "FPFastMathDefault and ContractionOff execution modes cannot "
                "be applied to the same entry point";
    }
    if (modes && modes->count(spv::ExecutionMode::SignedZeroInfNanPreserve)) {
      return _.diag(SPV_ERROR_INVALID_DATA, inst)
             << "FPFastMathDefault and SignedZeroInfNanPreserve execution "
                "modes cannot be applied to the same entry point";
    }
  }

  if (spvIsVulkanEnv(_.context()->target_env)) {
    if (mode == spv::ExecutionMode::OriginLowerLeft) {
      return _.diag(SPV_ERROR_INVALID_DATA, inst)
             << _.VkErrorID(4653)
             << "In the Vulkan environment, the OriginLowerLeft execution mode "
                "must not be used.";
    }
    if (mode == spv::ExecutionMode::PixelCenterInteger) {
      return _.diag(SPV_ERROR_INVALID_DATA, inst)
             << _.VkErrorID(4654)
             << "In the Vulkan environment, the PixelCenterInteger execution "
                "mode must not be used.";
    }
  }

  return SPV_SUCCESS;
}